

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t parser_parse_requestline(http_parser_t *parser)

{
  char cVar1;
  parse_status_t pVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  char *local_68;
  memptr url_str;
  int num_scanned;
  char save_char;
  long lStack_48;
  int index;
  memptr version_str;
  memptr method_str;
  http_message_t *hmsg;
  parse_status_t status;
  http_parser_t *parser_local;
  
  if (parser->position != POS_REQUEST_LINE) {
    __assert_fail("parser->position == POS_REQUEST_LINE",".upnp/src/genlib/net/http/httpparser.c",
                  0x4dc,"parse_status_t parser_parse_requestline(http_parser_t *)");
  }
  parser_local._4_4_ = skip_blank_lines(&parser->scanner);
  if (parser_local._4_4_ == PARSE_OK) {
    pVar2 = match(&parser->scanner,"%s\t%S%w%c",&version_str.length,&local_68);
    if (pVar2 == PARSE_OK) {
      iVar3 = map_str_to_int((char *)version_str.length,(size_t)method_str.buf,Http_Method_Table,0xb
                             ,1);
      if (iVar3 < 0) {
        parser->http_error_code = 0x1f5;
        parser_local._4_4_ = PARSE_FAILURE;
      }
      else if (Http_Method_Table[iVar3].id == 2) {
        (parser->msg).method = HTTPMETHOD_SIMPLEGET;
        while( true ) {
          bVar6 = false;
          if (((char *)0x1 < url_str.buf) && (bVar6 = false, *local_68 == '/')) {
            bVar6 = local_68[1] == '/';
          }
          if (!bVar6) break;
          local_68 = local_68 + 1;
          url_str.buf = url_str.buf + -1;
        }
        pcVar5 = str_alloc(local_68,(size_t)url_str.buf);
        (parser->msg).urlbuf = pcVar5;
        if ((parser->msg).urlbuf == (char *)0x0) {
          parser->http_error_code = 500;
          parser_local._4_4_ = PARSE_FAILURE;
        }
        else {
          iVar3 = parse_uri((parser->msg).urlbuf,(size_t)url_str.buf,&(parser->msg).uri);
          if (iVar3 == 1) {
            parser->position = POS_COMPLETE;
            parser_local._4_4_ = PARSE_SUCCESS;
          }
          else {
            parser_local._4_4_ = PARSE_FAILURE;
          }
        }
      }
      else {
        parser->http_error_code = 400;
        parser_local._4_4_ = PARSE_FAILURE;
      }
    }
    else {
      parser_local._4_4_ =
           match(&parser->scanner,"%s\t%S\t%ihttp%w/%w%L%c",&version_str.length,&local_68,
                 &stack0xffffffffffffffb8);
      if (parser_local._4_4_ == PARSE_OK) {
        while( true ) {
          bVar6 = false;
          if (((char *)0x1 < url_str.buf) && (bVar6 = false, *local_68 == '/')) {
            bVar6 = local_68[1] == '/';
          }
          if (!bVar6) break;
          local_68 = local_68 + 1;
          url_str.buf = url_str.buf + -1;
        }
        pcVar5 = str_alloc(local_68,(size_t)url_str.buf);
        (parser->msg).urlbuf = pcVar5;
        if ((parser->msg).urlbuf == (char *)0x0) {
          parser->http_error_code = 500;
          parser_local._4_4_ = PARSE_FAILURE;
        }
        else {
          iVar3 = parse_uri((parser->msg).urlbuf,(size_t)url_str.buf,&(parser->msg).uri);
          if (iVar3 == 1) {
            iVar3 = map_str_to_int((char *)version_str.length,(size_t)method_str.buf,
                                   Http_Method_Table,0xb,1);
            if (iVar3 < 0) {
              parser->http_error_code = 0x1f5;
              parser_local._4_4_ = PARSE_FAILURE;
            }
            else {
              cVar1 = version_str.buf[lStack_48];
              version_str.buf[lStack_48] = '\0';
              iVar4 = __isoc99_sscanf(lStack_48,"%d . %d",&(parser->msg).major_version,
                                      &(parser->msg).minor_version);
              version_str.buf[lStack_48] = cVar1;
              if (((iVar4 == 2) && (-1 < (parser->msg).major_version)) &&
                 (((parser->msg).major_version != 1 ||
                  ((0 < (parser->msg).minor_version || (Http_Method_Table[iVar3].id != 9)))))) {
                (parser->msg).method = Http_Method_Table[iVar3].id;
                parser->position = POS_HEADERS;
                parser_local._4_4_ = PARSE_OK;
              }
              else {
                parser->http_error_code = 0x1f9;
                parser_local._4_4_ = PARSE_FAILURE;
              }
            }
          }
          else {
            parser_local._4_4_ = PARSE_FAILURE;
          }
        }
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static parse_status_t parser_parse_requestline(http_parser_t *parser)
{
	parse_status_t status;
	http_message_t *hmsg = &parser->msg;
	memptr method_str;
	memptr version_str;
	int index;
	char save_char;
	int num_scanned;
	memptr url_str;

	assert(parser->position == POS_REQUEST_LINE);

	status = skip_blank_lines(&parser->scanner);
	if (status != (parse_status_t)PARSE_OK) {
		return status;
	}
	/*simple get http 0.9 as described in http 1.0 spec */

	status = match(&parser->scanner, "%s\t%S%w%c", &method_str, &url_str);

	if (status == (parse_status_t)PARSE_OK) {

		index = map_str_to_int(method_str.buf,
			method_str.length,
			Http_Method_Table,
			NUM_HTTP_METHODS,
			1);

		if (index < 0) {
			/* error; method not found */
			parser->http_error_code = HTTP_NOT_IMPLEMENTED;
			return PARSE_FAILURE;
		}

		if (Http_Method_Table[index].id != HTTPMETHOD_GET) {
			parser->http_error_code = HTTP_BAD_REQUEST;
			return PARSE_FAILURE;
		}

		hmsg->method = HTTPMETHOD_SIMPLEGET;

		/* remove excessive leading slashes, keep one slash */
		while (url_str.length >= 2 && url_str.buf[0] == '/' &&
			url_str.buf[1] == '/') {
			url_str.buf++;
			url_str.length--;
		}
		/* store url */
		hmsg->urlbuf = str_alloc(url_str.buf, url_str.length);
		if (hmsg->urlbuf == NULL) {
			/* out of mem */
			parser->http_error_code = HTTP_INTERNAL_SERVER_ERROR;
			return PARSE_FAILURE;
		}
		if (parse_uri(hmsg->urlbuf, url_str.length, &hmsg->uri) !=
			HTTP_SUCCESS) {
			return PARSE_FAILURE;
		}

		parser->position = POS_COMPLETE; /* move to headers */

		return PARSE_SUCCESS;
	}

	status = match(&parser->scanner,
		"%s\t%S\t%ihttp%w/%w%L%c",
		&method_str,
		&url_str,
		&version_str);
	if (status != (parse_status_t)PARSE_OK) {
		return status;
	}
	/* remove excessive leading slashes, keep one slash */
	while (url_str.length >= 2 && url_str.buf[0] == '/' &&
		url_str.buf[1] == '/') {
		url_str.buf++;
		url_str.length--;
	}
	/* store url */
	hmsg->urlbuf = str_alloc(url_str.buf, url_str.length);
	if (hmsg->urlbuf == NULL) {
		/* out of mem */
		parser->http_error_code = HTTP_INTERNAL_SERVER_ERROR;
		return PARSE_FAILURE;
	}
	if (parse_uri(hmsg->urlbuf, url_str.length, &hmsg->uri) !=
		HTTP_SUCCESS) {
		return PARSE_FAILURE;
	}

	index = map_str_to_int(method_str.buf,
		method_str.length,
		Http_Method_Table,
		NUM_HTTP_METHODS,
		1);
	if (index < 0) {
		/* error; method not found */
		parser->http_error_code = HTTP_NOT_IMPLEMENTED;
		return PARSE_FAILURE;
	}

	/* scan version */
	save_char = version_str.buf[version_str.length];
	version_str.buf[version_str.length] = '\0'; /* null-terminate */
#ifdef _WIN32
	num_scanned = sscanf_s(version_str.buf,
#else
	num_scanned = sscanf(version_str.buf,
#endif
		"%d . %d",
		&hmsg->major_version,
		&hmsg->minor_version);
	version_str.buf[version_str.length] = save_char; /* restore */
	if (num_scanned != 2 ||
		/* HTTP version equals to 1.0 should fail for MSEARCH as
		 * required by the UPnP certification tool */
		hmsg->major_version < 0 ||
		(hmsg->major_version == 1 && hmsg->minor_version < 1 &&
			Http_Method_Table[index].id == HTTPMETHOD_MSEARCH)) {
		parser->http_error_code = HTTP_HTTP_VERSION_NOT_SUPPORTED;
		/* error; bad http version */
		return PARSE_FAILURE;
	}

	hmsg->method = (http_method_t)Http_Method_Table[index].id;
	parser->position = POS_HEADERS; /* move to headers */

	return PARSE_OK;
}